

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

U32 ZSTD_dictAndWindowLog(U32 windowLog,U64 srcSize,U64 dictSize)

{
  U32 UVar1;
  ulong uVar2;
  ulong uVar3;
  U64 dictAndWindowSize;
  U64 windowSize;
  U64 maxWindowSize;
  U64 dictSize_local;
  U64 srcSize_local;
  U32 windowLog_local;
  
  srcSize_local._4_4_ = windowLog;
  if ((dictSize != 0) &&
     (uVar2 = 1L << ((byte)windowLog & 0x3f), uVar3 = dictSize + uVar2, uVar2 < dictSize + srcSize))
  {
    if (uVar3 < 0x80000000) {
      UVar1 = ZSTD_highbit32((int)uVar3 - 1);
      srcSize_local._4_4_ = UVar1 + 1;
    }
    else {
      srcSize_local._4_4_ = 0x1f;
    }
  }
  return srcSize_local._4_4_;
}

Assistant:

static U32 ZSTD_dictAndWindowLog(U32 windowLog, U64 srcSize, U64 dictSize)
{
    const U64 maxWindowSize = 1ULL << ZSTD_WINDOWLOG_MAX;
    /* No dictionary ==> No change */
    if (dictSize == 0) {
        return windowLog;
    }
    assert(windowLog <= ZSTD_WINDOWLOG_MAX);
    assert(srcSize != ZSTD_CONTENTSIZE_UNKNOWN); /* Handled in ZSTD_adjustCParams_internal() */
    {
        U64 const windowSize = 1ULL << windowLog;
        U64 const dictAndWindowSize = dictSize + windowSize;
        /* If the window size is already large enough to fit both the source and the dictionary
         * then just use the window size. Otherwise adjust so that it fits the dictionary and
         * the window.
         */
        if (windowSize >= dictSize + srcSize) {
            return windowLog; /* Window size large enough already */
        } else if (dictAndWindowSize >= maxWindowSize) {
            return ZSTD_WINDOWLOG_MAX; /* Larger than max window log */
        } else  {
            return ZSTD_highbit32((U32)dictAndWindowSize - 1) + 1;
        }
    }
}